

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTransfer.cpp
# Opt level: O2

void __thiscall CTransfer::CTransfer(CTransfer *this,string *ip,int port)

{
  uchar *puVar1;
  in_addr_t iVar2;
  long lVar3;
  
  this->_vptr_CTransfer = (_func_int **)&PTR___cxa_pure_virtual_00128568;
  std::__cxx11::string::string((string *)&this->ip,(string *)ip);
  this->port = port;
  this->maxi = 0;
  this->nready = 0;
  bzero(&this->sockaddr,0x10);
  iVar2 = inet_addr((ip->_M_dataplus)._M_p);
  (this->sockaddr).sin_addr.s_addr = iVar2;
  (this->sockaddr).sin_port = (ushort)port << 8 | (ushort)port >> 8;
  (this->sockaddr).sin_family = 2;
  for (lVar3 = 9; lVar3 != 0x3f1; lVar3 = lVar3 + 1) {
    puVar1 = (this->sockaddr).sin_zero + lVar3 * 8 + -0x14;
    puVar1[0] = 0xff;
    puVar1[1] = 0xff;
    puVar1[2] = 0xff;
    puVar1[3] = 0xff;
  }
  return;
}

Assistant:

CTransfer::CTransfer(std::string ip,int port)
        :port(port),ip(ip),maxi(0),nready(0){
    bzero(&sockaddr,sizeof(sockaddr));
    sockaddr.sin_addr.s_addr = inet_addr(ip.c_str());
    sockaddr.sin_port = htons(port);
    sockaddr.sin_family = AF_INET;

    for(int i = 0;i < OPEN_MAX;i++){
        pollfds[i].fd = -1;
    }
}